

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

vector<NPC_*,_std::allocator<NPC_*>_> * __thiscall
Map::NPCsInRange(vector<NPC_*,_std::allocator<NPC_*>_> *__return_storage_ptr__,Map *this,uchar x,
                uchar y,uchar range)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer ppNVar6;
  NPC *npc;
  NPC *local_38;
  
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppNVar2 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar6 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar6 != ppNVar2; ppNVar6 = ppNVar6 + 1) {
    local_38 = *ppNVar6;
    iVar4 = (uint)local_38->x - (uint)x;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar5 = (uint)local_38->y - (uint)y;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    if ((uint)(iVar4 + iVar3) <= (uint)range) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                  ((vector<NPC*,std::allocator<NPC*>> *)__return_storage_ptr__,__position,&local_38)
        ;
      }
      else {
        *__position._M_current = local_38;
        pppNVar1 = &(__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<NPC *> Map::NPCsInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<NPC *> npcs;

	UTIL_FOREACH(this->npcs, npc)
	{
		if (util::path_length(npc->x, npc->y, x, y) <= range)
			npcs.push_back(npc);
	}

	return npcs;
}